

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O2

int Tim_ManBoxFindFromCiNum(Tim_Man_t *p,int iCiNum)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  
  if ((-1 < iCiNum) && (iVar2 = Tim_ManCiNum(p), iCiNum < iVar2)) {
    iVar3 = Tim_ManPiNum(p);
    iVar2 = -1;
    iVar1 = -1;
    while( true ) {
      if (iCiNum < iVar3) {
        return iVar2;
      }
      i = iVar1 + 1;
      if (p->vBoxes->nSize <= i) break;
      Vec_PtrEntry(p->vBoxes,i);
      iVar3 = Tim_ManBoxOutputFirst(p,i);
      iVar2 = iVar1;
      iVar1 = i;
    }
    return -2;
  }
  __assert_fail("iCiNum >= 0 && iCiNum < Tim_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timBox.c"
                ,0x137,"int Tim_ManBoxFindFromCiNum(Tim_Man_t *, int)");
}

Assistant:

int Tim_ManBoxFindFromCiNum( Tim_Man_t * p, int iCiNum )
{
    Tim_Box_t * pBox;
    int i;
    assert( iCiNum >= 0 && iCiNum < Tim_ManCiNum(p) );
    if ( iCiNum < Tim_ManPiNum(p) )
        return -1;
    Tim_ManForEachBox( p, pBox, i )
        if ( iCiNum < Tim_ManBoxOutputFirst(p, i) )
            return i - 1;
    return -2;
}